

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allreduce_sockets.cc
# Opt level: O3

void __thiscall AllReduceSockets::all_reduce_init(AllReduceSockets *this)

{
  ushort uVar1;
  socket_t sVar2;
  socket_t __fd;
  int iVar3;
  hostent *phVar4;
  ssize_t sVar5;
  ostream *poVar6;
  int *piVar7;
  char *pcVar8;
  size_t sVar9;
  vw_exception *pvVar10;
  ulong uVar11;
  long *plVar12;
  char *pcVar13;
  uint16_t kid_count;
  unsigned_short netport;
  uint16_t parent_port;
  uint32_t parent_ip;
  int ok;
  socklen_t size;
  sockaddr_in address;
  stringstream __msg;
  char __errmsg [256];
  ushort local_36e;
  ushort local_36c;
  ushort local_36a;
  uint32_t local_368;
  int local_364;
  socket_t local_360;
  socklen_t local_35c;
  sockaddr local_358;
  string local_348;
  string local_328;
  string local_308;
  string local_2e8;
  stringstream local_2c8 [16];
  ostream local_2b8;
  char local_138 [264];
  
  phVar4 = gethostbyname((this->span_server)._M_dataplus._M_p);
  if (phVar4 == (hostent *)0x0) {
    std::__cxx11::stringstream::stringstream(local_2c8);
    std::__ostream_insert<char,std::char_traits<char>>(&local_2b8,"gethostbyname(",0xe);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (&local_2b8,(this->span_server)._M_dataplus._M_p,
                        (this->span_server)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    piVar7 = __errno_location();
    pcVar13 = local_138;
    pcVar8 = strerror_r(*piVar7,pcVar13,0x100);
    if (pcVar8 == (char *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>(&local_2b8,"errno = ",8);
      sVar9 = strlen(pcVar13);
    }
    else {
      sVar9 = 0xf;
      pcVar13 = "errno = unknown";
    }
    std::__ostream_insert<char,std::char_traits<char>>(&local_2b8,pcVar13,sVar9);
    pvVar10 = (vw_exception *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringbuf::str();
    VW::vw_exception::vw_exception
              (pvVar10,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/allreduce_sockets.cc"
               ,0x71,&local_2e8);
    __cxa_throw(pvVar10,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  std::__cxx11::string::_M_assign((string *)&this->socks);
  uVar1 = (ushort)this->port;
  sVar2 = sock_connect(*(uint32_t *)*phVar4->h_addr_list,(uint)(ushort)(uVar1 << 8 | uVar1 >> 8));
  sVar5 = send(sVar2,&this->unique_id,8,0);
  if (sVar5 < 8) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"write unique_id=",0x10);
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," to span server failed",0x16);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"wrote unique_id=",0x10);
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
  }
  std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  sVar5 = send(sVar2,&(this->super_AllReduce).total,8,0);
  if (sVar5 < 8) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"write total=",0xc);
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," to span server failed",0x16);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"wrote total=",0xc);
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
  }
  std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  sVar5 = send(sVar2,&(this->super_AllReduce).node,8,0);
  if (sVar5 < 8) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"write node=",0xb);
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," to span server failed",0x16);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"wrote node=",0xb);
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
  }
  std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  sVar5 = recv(sVar2,&local_364,4,0);
  plVar12 = &std::cerr;
  if (sVar5 < 4) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"read ok from span server failed",0x1f);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"read ok=",8);
    plVar12 = (long *)std::ostream::operator<<(&std::cerr,local_364);
  }
  std::ios::widen((char)*(undefined8 *)(*plVar12 + -0x18) + (char)plVar12);
  std::ostream::put((char)plVar12);
  std::ostream::flush();
  if (local_364 != 0) {
    sVar5 = recv(sVar2,&local_36e,2,0);
    poVar6 = (ostream *)&std::cerr;
    if (sVar5 < 2) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"read kid_count from span server failed",0x26);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"read kid_count=",0xf);
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
    }
    std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    local_36c = 0xb067;
    if (local_36e == 0) {
      __fd = -1;
    }
    else {
      local_360 = sVar2;
      __fd = getsock();
      local_358.sa_family = 2;
      local_358.sa_data[2] = '\0';
      local_358.sa_data[3] = '\0';
      local_358.sa_data[4] = '\0';
      local_358.sa_data[5] = '\0';
      local_358.sa_data[0] = (undefined1)local_36c;
      local_358.sa_data[1] = local_36c._1_1_;
      while( true ) {
        while (iVar3 = bind(__fd,&local_358,0x10), iVar3 < 0) {
          piVar7 = __errno_location();
          if (*piVar7 != 0x62) {
            std::__cxx11::stringstream::stringstream(local_2c8);
            std::__ostream_insert<char,std::char_traits<char>>(&local_2b8,"bind",4);
            pcVar13 = local_138;
            pcVar8 = strerror_r(*piVar7,pcVar13,0x100);
            if (pcVar8 == (char *)0x0) {
              std::__ostream_insert<char,std::char_traits<char>>(&local_2b8,"errno = ",8);
              sVar9 = strlen(pcVar13);
            }
            else {
              sVar9 = 0xf;
              pcVar13 = "errno = unknown";
            }
            std::__ostream_insert<char,std::char_traits<char>>(&local_2b8,pcVar13,sVar9);
            pvVar10 = (vw_exception *)__cxa_allocate_exception(0x38);
            std::__cxx11::stringbuf::str();
            VW::vw_exception::vw_exception
                      (pvVar10,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/allreduce_sockets.cc"
                       ,0xae,&local_328);
            __cxa_throw(pvVar10,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
          }
          uVar1 = (local_36c << 8 | local_36c >> 8) + 1;
          local_36c = uVar1 * 0x100 | uVar1 >> 8;
          local_358.sa_data._0_2_ = local_36c;
        }
        iVar3 = listen(__fd,(uint)local_36e);
        sVar2 = local_360;
        if (-1 < iVar3) break;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"listen: ",8);
        piVar7 = __errno_location();
        pcVar13 = strerror(*piVar7);
        if (pcVar13 == (char *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x2dca28);
        }
        else {
          sVar9 = strlen(pcVar13);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar13,sVar9);
        }
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '(');
        std::ostream::put('(');
        std::ostream::flush();
        close(__fd);
        __fd = getsock();
      }
    }
    sVar5 = send(sVar2,&local_36c,2,0);
    if (sVar5 < 2) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"write netport failed!",0x15);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '(');
      std::ostream::put('(');
      std::ostream::flush();
    }
    sVar5 = recv(sVar2,&local_368,4,0);
    if (sVar5 < 4) {
      poVar6 = (ostream *)&std::cerr;
      pcVar13 = "read parent_ip failed!";
      sVar9 = 0x16;
    }
    else {
      pcVar13 = inet_ntop(2,&local_368,(char *)local_2c8,0x10);
      poVar6 = (ostream *)&std::cerr;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"read parent_ip=",0xf);
      if (pcVar13 == (char *)0x0) {
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"(inet_ntop: ",0xc);
        piVar7 = __errno_location();
        pcVar13 = strerror(*piVar7);
        if (pcVar13 == (char *)0x0) {
          std::ios::clear((int)poVar6 + (int)poVar6->_vptr_basic_ostream[-3]);
        }
        else {
          sVar9 = strlen(pcVar13);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar13,sVar9);
        }
        pcVar13 = ")";
        sVar9 = 1;
      }
      else {
        pcVar13 = (char *)local_2c8;
        sVar9 = strlen(pcVar13);
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar13,sVar9);
    std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    sVar5 = recv(sVar2,&local_36a,2,0);
    poVar6 = (ostream *)&std::cerr;
    if (sVar5 < 2) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"read parent_port failed!",0x18);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"read parent_port=",0x11);
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
    }
    std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    close(sVar2);
    if (local_368 == 0xffffffff) {
      sVar2 = -1;
    }
    else {
      sVar2 = sock_connect(local_368,(uint)local_36a);
    }
    (this->socks).parent = sVar2;
    (this->socks).children[0] = -1;
    (this->socks).children[1] = -1;
    if (local_36e != 0) {
      uVar11 = 0;
      do {
        local_35c = 0x10;
        iVar3 = accept(__fd,&local_358,&local_35c);
        if (iVar3 < 0) {
          std::__cxx11::stringstream::stringstream(local_2c8);
          std::__ostream_insert<char,std::char_traits<char>>(&local_2b8,"accept",6);
          piVar7 = __errno_location();
          pcVar13 = local_138;
          pcVar8 = strerror_r(*piVar7,pcVar13,0x100);
          if (pcVar8 == (char *)0x0) {
            std::__ostream_insert<char,std::char_traits<char>>(&local_2b8,"errno = ",8);
            sVar9 = strlen(pcVar13);
          }
          else {
            sVar9 = 0xf;
            pcVar13 = "errno = unknown";
          }
          std::__ostream_insert<char,std::char_traits<char>>(&local_2b8,pcVar13,sVar9);
          pvVar10 = (vw_exception *)__cxa_allocate_exception(0x38);
          std::__cxx11::stringbuf::str();
          VW::vw_exception::vw_exception
                    (pvVar10,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/allreduce_sockets.cc"
                     ,0xe5,&local_348);
          __cxa_throw(pvVar10,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
        }
        (this->socks).children[uVar11] = iVar3;
        uVar11 = uVar11 + 1;
      } while (uVar11 < local_36e);
      if (local_36e != 0) {
        close(__fd);
      }
    }
    return;
  }
  std::__cxx11::stringstream::stringstream(local_2c8);
  std::__ostream_insert<char,std::char_traits<char>>(&local_2b8,"mapper already connected",0x18);
  pvVar10 = (vw_exception *)__cxa_allocate_exception(0x38);
  std::__cxx11::stringbuf::str();
  VW::vw_exception::vw_exception
            (pvVar10,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/allreduce_sockets.cc"
             ,0x8a,&local_308);
  __cxa_throw(pvVar10,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
}

Assistant:

void AllReduceSockets::all_reduce_init()
{
#ifdef _WIN32
  WSAData wsaData;
  int lastError = WSAStartup(MAKEWORD(2, 2), &wsaData);
  if (lastError != 0)
    THROWERRNO("WSAStartup() returned error:" << lastError);
#endif

  struct hostent* master = gethostbyname(span_server.c_str());

  if (master == nullptr)
    THROWERRNO("gethostbyname(" << span_server << ")");

  socks.current_master = span_server;

  uint32_t master_ip = *((uint32_t*)master->h_addr);

  socket_t master_sock = sock_connect(master_ip, htons(port));
  if (send(master_sock, (const char*)&unique_id, sizeof(unique_id), 0) < (int)sizeof(unique_id))
    cerr << "write unique_id=" << unique_id << " to span server failed" << endl;
  else
    cerr << "wrote unique_id=" << unique_id << endl;
  if (send(master_sock, (const char*)&total, sizeof(total), 0) < (int)sizeof(total))
    cerr << "write total=" << total << " to span server failed" << endl;
  else
    cerr << "wrote total=" << total << endl;
  if (send(master_sock, (char*)&node, sizeof(node), 0) < (int)sizeof(node))
    cerr << "write node=" << node << " to span server failed" << endl;
  else
    cerr << "wrote node=" << node << endl;
  int ok;
  if (recv(master_sock, (char*)&ok, sizeof(ok), 0) < (int)sizeof(ok))
    cerr << "read ok from span server failed" << endl;
  else
    cerr << "read ok=" << ok << endl;
  if (!ok)
    THROW("mapper already connected");

  uint16_t kid_count;
  uint16_t parent_port;
  uint32_t parent_ip;

  if (recv(master_sock, (char*)&kid_count, sizeof(kid_count), 0) < (int)sizeof(kid_count))
    cerr << "read kid_count from span server failed" << endl;
  else
    cerr << "read kid_count=" << kid_count << endl;

  socket_t sock = -1;
  short unsigned int netport = htons(26544);
  if (kid_count > 0)
  {
    sock = getsock();
    sockaddr_in address;
    address.sin_family = AF_INET;
    address.sin_addr.s_addr = htonl(INADDR_ANY);
    address.sin_port = netport;

    bool listening = false;
    while (!listening)
    {
      if (::bind(sock, (sockaddr*)&address, sizeof(address)) < 0)
      {
#ifdef _WIN32
        if (WSAGetLastError() == WSAEADDRINUSE)
#else
        if (errno == EADDRINUSE)
#endif
        {
          netport = htons(ntohs(netport) + 1);
          address.sin_port = netport;
        }
        else
          THROWERRNO("bind");
      }
      else
      {
        if (listen(sock, kid_count) < 0)
        {
          cerr << "listen: " << strerror(errno) << endl;
          CLOSESOCK(sock);
          sock = getsock();
        }
        else
        {
          listening = true;
        }
      }
    }
  }

  if (send(master_sock, (const char*)&netport, sizeof(netport), 0) < (int)sizeof(netport))
    cerr << "write netport failed!" << endl;

  if (recv(master_sock, (char*)&parent_ip, sizeof(parent_ip), 0) < (int)sizeof(parent_ip))
    cerr << "read parent_ip failed!" << endl;
  else
  {
    char dotted_quad[INET_ADDRSTRLEN];
    if (nullptr == inet_ntop(AF_INET, (char*)&parent_ip, dotted_quad, INET_ADDRSTRLEN))
    {
      cerr << "read parent_ip=" << parent_ip << "(inet_ntop: " << strerror(errno) << ")" << endl;
    }
    else
      cerr << "read parent_ip=" << dotted_quad << endl;
  }
  if (recv(master_sock, (char*)&parent_port, sizeof(parent_port), 0) < (int)sizeof(parent_port))
    cerr << "read parent_port failed!" << endl;
  else
    cerr << "read parent_port=" << parent_port << endl;

  CLOSESOCK(master_sock);

  if (parent_ip != (uint32_t)-1)
  {
    socks.parent = sock_connect(parent_ip, parent_port);
  }
  else
    socks.parent = -1;

  socks.children[0] = -1;
  socks.children[1] = -1;
  for (int i = 0; i < kid_count; i++)
  {
    sockaddr_in child_address;
    socklen_t size = sizeof(child_address);
    socket_t f = accept(sock, (sockaddr*)&child_address, &size);
    if (f < 0)
      THROWERRNO("accept");

    // char hostname[NI_MAXHOST];
    // char servInfo[NI_MAXSERV];
    // getnameinfo((sockaddr *) &child_address, sizeof(sockaddr), hostname, NI_MAXHOST, servInfo, NI_MAXSERV,
    // NI_NUMERICSERV); cerr << "connected to " << hostname << ':' << ntohs(port) << endl;
    socks.children[i] = f;
  }

  if (kid_count > 0)
    CLOSESOCK(sock);
}